

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O1

void Gia_Ga2SendAbsracted(Ga2_Man_t *p,int fVerbose)

{
  int iVar1;
  Vec_Int_t *vGateClasses;
  Gia_Man_t *p_00;
  
  iVar1 = Abc_FrameIsBridgeMode();
  if (iVar1 != 0) {
    vGateClasses = Ga2_ManAbsTranslate(p);
    p_00 = Gia_ManDupAbsGates(p->pGia,vGateClasses);
    if (vGateClasses != (Vec_Int_t *)0x0) {
      if (vGateClasses->pArray != (int *)0x0) {
        free(vGateClasses->pArray);
        vGateClasses->pArray = (int *)0x0;
      }
      free(vGateClasses);
    }
    Gia_ManCleanValue(p->pGia);
    Gia_ManToBridgeAbsNetlist(_stdout,p_00,0x6b);
    Gia_ManStop(p_00);
    return;
  }
  __assert_fail("Abc_FrameIsBridgeMode()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/abs/absGla.c"
                ,0x5bc,"void Gia_Ga2SendAbsracted(Ga2_Man_t *, int)");
}

Assistant:

void Gia_Ga2SendAbsracted( Ga2_Man_t * p, int fVerbose )
{
    Gia_Man_t * pAbs;
    Vec_Int_t * vGateClasses;
    assert( Abc_FrameIsBridgeMode() );
//    if ( fVerbose )
//        Abc_Print( 1, "Sending abstracted model...\n" );
    // create abstraction (value of p->pGia is not used here)
    vGateClasses = Ga2_ManAbsTranslate( p );
    pAbs = Gia_ManDupAbsGates( p->pGia, vGateClasses );
    Vec_IntFreeP( &vGateClasses );
    Gia_ManCleanValue( p->pGia );
    // send it out
    Gia_ManToBridgeAbsNetlist( stdout, pAbs, BRIDGE_ABS_NETLIST );
    Gia_ManStop( pAbs );
}